

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TestPartResult *in_RSI;
  char *file_name;
  String *this_00;
  string local_b8 [32];
  String *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff88;
  StreamingListener *in_stack_ffffffffffffff90;
  String local_68 [2];
  char local_48 [16];
  string local_38 [32];
  char *local_18;
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  local_18 = TestPartResult::file_name((TestPartResult *)0x206bd1);
  if (local_18 == (char *)0x0) {
    local_18 = "";
  }
  this_00 = local_68;
  UrlEncode_abi_cxx11_((char *)in_stack_ffffffffffffff88);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::__cxx11::string::c_str();
  uVar1 = TestPartResult::line_number(local_10);
  String::Format(local_48,"event=TestPartResult&file=%s&line=%d&message=",__lhs,(ulong)uVar1);
  String::operator_cast_to_string(in_stack_ffffffffffffff68);
  Send(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_38);
  String::~String(this_00);
  std::__cxx11::string::~string((string *)local_68);
  TestPartResult::message((TestPartResult *)0x206ca1);
  UrlEncode_abi_cxx11_((char *)in_stack_ffffffffffffff88);
  std::operator+(__lhs,(char *)this_00);
  Send(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    Send(String::Format("event=TestPartResult&file=%s&line=%d&message=",
                        UrlEncode(file_name).c_str(),
                        test_part_result.line_number()));
    Send(UrlEncode(test_part_result.message()) + "\n");
  }